

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::ValidationErrorCollector::RecordWarning
          (ValidationErrorCollector *this,string_view filename,string_view element_name,
          Message *descriptor,ErrorLocation location,string_view message)

{
  MultiFileErrorCollector *pMVar1;
  SourceLocationTable *this_00;
  uint local_28;
  uint local_24;
  
  if (this->owner_->error_collector_ != (MultiFileErrorCollector *)0x0) {
    this_00 = &this->owner_->source_locations_;
    if (location == IMPORT) {
      SourceLocationTable::FindImport
                (this_00,descriptor,element_name,(int *)&local_24,(int *)&local_28);
    }
    else {
      SourceLocationTable::Find(this_00,descriptor,location,(int *)&local_24,(int *)&local_28);
    }
    pMVar1 = this->owner_->error_collector_;
    (*pMVar1->_vptr_MultiFileErrorCollector[3])
              (pMVar1,filename._M_len,filename._M_str,(ulong)local_24,(ulong)local_28);
  }
  return;
}

Assistant:

void SourceTreeDescriptorDatabase::ValidationErrorCollector::RecordWarning(
    absl::string_view filename, absl::string_view element_name,
    const Message* descriptor, ErrorLocation location,
    absl::string_view message) {
  if (owner_->error_collector_ == nullptr) return;

  int line, column;
  if (location == DescriptorPool::ErrorCollector::IMPORT) {
    owner_->source_locations_.FindImport(descriptor, element_name, &line,
                                         &column);
  } else {
    owner_->source_locations_.Find(descriptor, location, &line, &column);
  }
  owner_->error_collector_->RecordWarning(filename, line, column, message);
}